

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

float __thiscall
tcu::TextureCubeArrayView::sampleCompare
          (TextureCubeArrayView *this,Sampler *sampler,float ref,float s,float t,float r,float q,
          float lod)

{
  ConstPixelBufferAccess *levels;
  float s_00;
  CubeFace t_00;
  float lod_00;
  int iVar1;
  Vector<int,_3> local_74;
  int local_68;
  int local_64;
  int faceDepth;
  int layer;
  float local_58;
  Vector<float,_3> local_50;
  undefined8 local_44;
  CubeFaceFloatCoords coords;
  float lod_local;
  float q_local;
  float r_local;
  float t_local;
  float s_local;
  float ref_local;
  Sampler *sampler_local;
  TextureCubeArrayView *this_local;
  
  coords.s = lod;
  coords.t = q;
  Vector<float,_3>::Vector(&local_50,s,t,r);
  _faceDepth = getCubeFaceCoords(&local_50);
  local_44 = _faceDepth;
  coords.face = (CubeFace)local_58;
  local_64 = selectLayer(this,coords.t);
  iVar1 = local_64 * 6;
  local_68 = getCubeArrayFaceIndex((CubeFace)local_44);
  lod_00 = coords.s;
  t_00 = coords.face;
  local_68 = iVar1 + local_68;
  s_00 = local_44._4_4_;
  if ((sampler->seamlessCubeMap & 1U) == 0) {
    levels = this->m_levels;
    iVar1 = this->m_numLevels;
    Vector<int,_3>::Vector(&local_74,0,0,local_68);
    this_local._4_4_ =
         sampleLevelArray2DCompare(levels,iVar1,sampler,ref,s_00,(float)t_00,lod_00,&local_74);
  }
  else {
    this_local._4_4_ =
         sampleCubeArraySeamlessCompare
                   (this->m_levels,this->m_numLevels,local_64,(CubeFace)local_44,sampler,ref,
                    local_44._4_4_,(float)coords.face,coords.s);
  }
  return this_local._4_4_;
}

Assistant:

float TextureCubeArrayView::sampleCompare (const Sampler& sampler, float ref, float s, float t, float r, float q, float lod) const
{
	const CubeFaceFloatCoords	coords		= getCubeFaceCoords(Vec3(s, t, r));
	const int					layer		= selectLayer(q);
	const int					faceDepth	= (layer * 6) + getCubeArrayFaceIndex(coords.face);

	DE_ASSERT(sampler.compare != Sampler::COMPAREMODE_NONE);

	if (sampler.seamlessCubeMap)
		return sampleCubeArraySeamlessCompare(m_levels, m_numLevels, layer, coords.face, sampler, ref, coords.s, coords.t, lod);
	else
		return sampleLevelArray2DCompare(m_levels, m_numLevels, sampler, ref, coords.s, coords.t, lod, IVec3(0, 0, faceDepth));
}